

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  uchar *puVar13;
  float fVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar5 = *y * *x;
      pfVar2 = (float *)malloc((long)(int)(req_comp * uVar5) << 2);
      if (pfVar2 != (float *)0x0) {
        if (0 < (int)uVar5) {
          uVar9 = (req_comp + (req_comp & 1U)) - 1;
          lVar3 = (long)req_comp;
          uVar6 = 0;
          pfVar7 = pfVar2;
          puVar13 = __ptr;
          do {
            uVar10 = 0;
            if (0 < (int)uVar9) {
              uVar10 = 0;
              do {
                fVar14 = powf((float)puVar13[uVar10] / 255.0,stbi__l2h_gamma);
                pfVar7[uVar10] = fVar14 * stbi__l2h_scale;
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
            if ((int)uVar10 < req_comp) {
              lVar12 = (long)(int)uVar10 + uVar6 * lVar3;
              pfVar2[lVar12] = (float)__ptr[lVar12] / 255.0;
            }
            uVar6 = uVar6 + 1;
            pfVar7 = pfVar7 + lVar3;
            puVar13 = puVar13 + lVar3;
          } while (uVar6 != uVar5);
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar5 = *y >> 1;
      if (0 < (int)uVar5) {
        iVar1 = *x;
        lVar3 = (long)req_comp;
        iVar4 = (*y + -1) * iVar1;
        uVar6 = 0;
        pfVar7 = pfVar2;
        do {
          if (0 < iVar1) {
            pfVar8 = (float *)((long)iVar4 * lVar3 * 4 + (long)pfVar2);
            lVar12 = 0;
            pfVar11 = pfVar7;
            do {
              if (0 < req_comp) {
                uVar10 = 0;
                do {
                  fVar14 = pfVar11[uVar10];
                  pfVar11[uVar10] = pfVar8[uVar10];
                  pfVar8[uVar10] = fVar14;
                  uVar10 = uVar10 + 1;
                } while ((uint)req_comp != uVar10);
              }
              lVar12 = lVar12 + 1;
              pfVar8 = pfVar8 + lVar3;
              pfVar11 = pfVar11 + lVar3;
            } while (lVar12 != iVar1);
          }
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 - iVar1;
          pfVar7 = pfVar7 + lVar3 * iVar1;
        } while (uVar6 != uVar5);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}